

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

any * __thiscall
Omega_h::InputYamlReader::at_reduce
          (any *__return_storage_ptr__,InputYamlReader *this,int prod,
          vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs)

{
  size_t parent_indent_level_00;
  bool bVar1;
  char cVar2;
  type_info *ptVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *leading_empties_or_comments_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_00;
  reference pvVar7;
  ostream *poVar8;
  ParserFail *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  char local_50f [15];
  string local_500 [32];
  string local_4e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_5;
  string local_4b8 [32];
  stringstream local_498 [8];
  stringstream ss;
  ostream local_488 [376];
  string local_310 [8];
  string str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_3;
  string str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_2;
  string str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_1;
  string result_1;
  string local_278 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_1;
  string local_258 [8];
  string ignored_comment;
  string local_238 [8];
  string content;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *leading_empties_or_comments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  value_type parent_indent_level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string local_1d8 [32];
  string local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> text_1;
  string local_198 [8];
  string result;
  size_type sStack_170;
  char second;
  size_t offset_1;
  string local_148 [8];
  string text;
  InputList local_128;
  InputMap local_f8;
  InputMap local_a8;
  undefined1 local_41;
  InputMap *local_40;
  InputMap *map;
  value_type *result_any;
  size_t offset;
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs_local;
  InputYamlReader *pIStack_18;
  int prod_local;
  InputYamlReader *this_local;
  any *result_any_1;
  
  offset = (size_t)rhs;
  rhs_local._4_4_ = prod;
  pIStack_18 = this;
  this_local = (InputYamlReader *)__return_storage_ptr__;
  switch(prod) {
  case 0:
  case 1:
    result_any = (value_type *)(long)(int)(uint)(prod == 1);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,(size_type)result_any)
    ;
    bVar1 = any::empty(pvVar7);
    if (bVar1) {
      fail("assertion %s failed at %s +%d\n","!rhs.at(offset).empty()",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x178);
    }
    map = (InputMap *)
          std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                    ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,
                     (size_type)result_any);
    ptVar3 = any::type((any *)map);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputMap::typeinfo);
    if (!bVar1) {
      fail("assertion %s failed at %s +%d\n","result_any.type() == typeid(InputMap)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x17a);
    }
    local_40 = any_cast<Omega_h::InputMap&>((any *)map);
    (local_40->super_Input).used = true;
    any::any(__return_storage_ptr__,(any *)map);
    break;
  case 2:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    ptVar3 = any::type(pvVar7);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&NameValue::typeinfo);
    if (bVar1) {
      pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                         ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
      map_first_item(__return_storage_ptr__,this,pvVar7);
    }
    else {
      any::any(__return_storage_ptr__);
    }
    break;
  case 3:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    ptVar3 = any::type(pvVar7);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&NameValue::typeinfo);
    if (bVar1) {
      pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                         ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
      ptVar3 = any::type(pvVar7);
      bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputMap::typeinfo);
      if (bVar1) {
        pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                           ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
        pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                           ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,1);
        map_next_item(__return_storage_ptr__,this,pvVar7,pvVar4);
      }
      else {
        pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                           ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
        map_first_item(__return_storage_ptr__,this,pvVar7);
      }
    }
    else {
      pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                         ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
      any::any(__return_storage_ptr__,pvVar7);
    }
    break;
  default:
    any::any(__return_storage_ptr__);
    break;
  case 7:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 8:
  case 0x1e:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    ptVar3 = any::type(pvVar7);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&NameValue::typeinfo);
    if (!bVar1) {
      fail("assertion %s failed at %s +%d\n","rhs.at(0).type() == typeid(NameValue)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x195);
    }
    local_41 = 0;
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
    map_first_item(__return_storage_ptr__,this,pvVar7);
    ptVar3 = any::type(__return_storage_ptr__);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputMap::typeinfo);
    if (!bVar1) {
      fail("assertion %s failed at %s +%d\n","result_any.type() == typeid(InputMap)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x197);
    }
    break;
  case 9:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,1);
    map_next_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 10:
  case 0x20:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,4);
    map_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0xb:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,3);
    map_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0xc:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,4);
    map_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0xd:
    local_a8.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_a8.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_a8.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8.map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_a8.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8.super_Input.used = false;
    local_a8.super_Input._17_7_ = 0;
    local_a8.map._M_t._M_impl._0_8_ = 0;
    local_a8.super_Input._vptr_Input = (_func_int **)0x0;
    local_a8.super_Input.parent = (Input *)0x0;
    local_a8.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    InputMap::InputMap(&local_a8);
    any::any<Omega_h::InputMap,void>(__return_storage_ptr__,&local_a8);
    InputMap::~InputMap(&local_a8);
    break;
  case 0xe:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0xf:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x10:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,4);
    map_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0x11:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,4);
    map_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0x12:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    seq_first_item(__return_storage_ptr__,this,pvVar7);
    break;
  case 0x13:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,1);
    seq_next_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0x14:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x15:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x16:
  case 0x1a:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x17:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,4);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x18:
  case 0x1b:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x19:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,4);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x1c:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x1d:
    local_f8.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_f8.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_f8.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f8.map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_f8.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f8.super_Input.used = false;
    local_f8.super_Input._17_7_ = 0;
    local_f8.map._M_t._M_impl._0_8_ = 0;
    local_f8.super_Input._vptr_Input = (_func_int **)0x0;
    local_f8.super_Input.parent = (Input *)0x0;
    local_f8.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    InputMap::InputMap(&local_f8);
    any::any<Omega_h::InputMap,void>(__return_storage_ptr__,&local_f8);
    InputMap::~InputMap(&local_f8);
    break;
  case 0x1f:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,3);
    map_next_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0x21:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,4);
    map_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0x22:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,4);
    map_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0x23:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x24:
    local_128.entries.
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.entries.
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128.super_Input.used = false;
    local_128.super_Input._17_7_ = 0;
    local_128.entries.
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super_Input._vptr_Input = (_func_int **)0x0;
    local_128.super_Input.parent = (Input *)0x0;
    InputList::InputList(&local_128);
    any::any<Omega_h::InputList,void>(__return_storage_ptr__,&local_128);
    InputList::~InputList(&local_128);
    break;
  case 0x25:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    seq_first_item(__return_storage_ptr__,this,pvVar7);
    break;
  case 0x26:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,3);
    seq_next_item(__return_storage_ptr__,this,pvVar7,pvVar4);
    break;
  case 0x27:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x28:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x29:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x2a:
  case 0x2c:
    std::__cxx11::string::string(local_148);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
    bVar1 = any::empty(pvVar7);
    if (bVar1) {
      fail("assertion %s failed at %s +%d\n","!rhs.at(0).empty()",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x1fb);
    }
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
    pbVar9 = any_cast<std::__cxx11::string&&>(pvVar7);
    std::__cxx11::string::operator=(local_148,(string *)pbVar9);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,1);
    pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
    std::__cxx11::string::operator+=(local_148,(string *)pbVar9);
    if (rhs_local._4_4_ == 0x2c) {
      pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                         ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,2);
      pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
      std::__cxx11::string::operator+=(local_148,(string *)pbVar9);
    }
    remove_trailing_whitespace((Omega_h *)&offset_1,(string *)local_148);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset_1);
    std::__cxx11::string::~string((string *)&offset_1);
    std::__cxx11::string::~string(local_148);
    break;
  case 0x2b:
  case 0x2d:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x2e:
  case 0x2f:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    pbVar9 = any_cast<std::__cxx11::string&&>(pvVar7);
    std::__cxx11::string::string(local_1b8,(string *)pbVar9);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,2);
    pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
    std::__cxx11::string::operator+=(local_1b8,(string *)pbVar9);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    std::__cxx11::string::~string(local_1b8);
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
    if (prod == 0x30) {
      sStack_170 = 0;
    }
    else if (prod == 0x33) {
      sStack_170 = 2;
    }
    else {
      sStack_170 = 1;
    }
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,sStack_170);
    cVar2 = any_cast<char>(pvVar7);
    std::__cxx11::string::string(local_198);
    if (rhs_local._4_4_ == 0x31) {
      std::__cxx11::string::operator+=(local_198,'.');
    }
    else if (rhs_local._4_4_ == 0x32) {
      std::__cxx11::string::operator+=(local_198,'-');
    }
    else if (rhs_local._4_4_ == 0x33) {
      std::__cxx11::string::operator+=(local_198,"..");
    }
    std::__cxx11::string::operator+=(local_198,cVar2);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    std::__cxx11::string::~string(local_198);
    break;
  case 0x34:
    std::__cxx11::string::string(local_1d8);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    std::__cxx11::string::~string(local_1d8);
    break;
  case 0x35:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar9 = any_cast<std::__cxx11::string&&>(pvVar7);
    std::__cxx11::string::string((string *)&parent_indent_level,(string *)pbVar9);
    std::__cxx11::string::operator+=((string *)&parent_indent_level,',');
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,2);
    pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
    std::__cxx11::string::operator+=((string *)&parent_indent_level,(string *)pbVar9);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &parent_indent_level);
    std::__cxx11::string::~string((string *)&parent_indent_level);
    break;
  case 0x37:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x38:
    this_01 = &(this->super_Reader).symbol_indentation_stack;
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_01);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(this_01,sVar5 - 5);
    parent_indent_level_00 = *pvVar6;
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
    pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,2);
    leading_empties_or_comments_00 = any_cast<std::__cxx11::string&>(pvVar7);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,4);
    rest_00 = any_cast<std::__cxx11::string&>(pvVar7);
    std::__cxx11::string::string(local_238);
    std::__cxx11::string::string(local_258);
    handle_block_scalar(this,parent_indent_level_00,pbVar9,leading_empties_or_comments_00,rest_00,
                        (string *)local_238,(string *)local_258);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::string::~string(local_238);
    break;
  case 0x39:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x3a:
  case 0x3b:
  case 0x4a:
  case 0x4d:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar9 = any_cast<std::__cxx11::string&&>(pvVar7);
    std::__cxx11::string::string(local_278,(string *)pbVar9);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,1);
    pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
    std::__cxx11::string::operator+=(local_278,(string *)pbVar9);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
    std::__cxx11::string::~string(local_278);
    break;
  case 0x3c:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x3d:
  case 0x3e:
    std::__cxx11::string::string((string *)&rest_1);
    if (rhs_local._4_4_ == 0x3d) {
      std::__cxx11::string::operator+=((string *)&rest_1,"|");
    }
    else {
      std::__cxx11::string::operator+=((string *)&rest_1,">");
    }
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,1);
    pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
    std::__cxx11::string::operator+=((string *)&rest_1,(string *)pbVar9);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rest_1);
    std::__cxx11::string::~string((string *)&rest_1);
    break;
  case 0x3f:
  case 0x43:
  case 0x45:
  case 0x47:
  case 0x49:
  case 0x4c:
  case 0x4f:
  case 0x72:
    std::__cxx11::string::string(local_500);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500);
    std::__cxx11::string::~string(local_500);
    break;
  case 0x40:
  case 0x44:
  case 0x46:
  case 0x48:
  case 0x50:
  case 0x73:
  case 0x75:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    bVar1 = any::empty(pvVar7);
    if (bVar1) {
      std::__cxx11::stringstream::stringstream(local_498);
      poVar8 = std::operator<<(local_488,"leading characters in ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,rhs_local._4_4_);
      std::operator<<(poVar8,": any was empty\n");
      this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      ParserFail::ParserFail(this_00,local_4b8);
      __cxa_throw(this_00,&ParserFail::typeinfo,ParserFail::~ParserFail);
    }
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
    pbVar9 = any_cast<std::__cxx11::string&&>(pvVar7);
    std::__cxx11::string::string(local_4e0,(string *)pbVar9);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,1);
    cVar2 = any_cast<char>(pvVar7);
    std::__cxx11::string::operator+=(local_4e0,cVar2);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e0);
    std::__cxx11::string::~string(local_4e0);
    break;
  case 0x41:
  case 0x53:
  case 0x57:
  case 0x5a:
  case 0x5b:
  case 0x5d:
  case 0x60:
  case 100:
  case 0x71:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any::any(__return_storage_ptr__,pvVar7);
    break;
  case 0x42:
  case 0x55:
  case 0x67:
    local_50f[9] = 0x2d;
    any::any<char,void>(__return_storage_ptr__,local_50f + 9);
    break;
  case 0x4b:
    std::__cxx11::string::string((string *)&rest_2);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,2);
    pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,1);
    cVar2 = any_cast<char>(pvVar7);
    std::__cxx11::string::operator+=((string *)&rest_2,cVar2);
    std::__cxx11::string::operator+=((string *)&rest_2,(string *)pbVar9);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rest_2);
    std::__cxx11::string::~string((string *)&rest_2);
    break;
  case 0x4e:
    std::__cxx11::string::string((string *)&rest_3);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,2);
    pbVar9 = any_cast<std::__cxx11::string&>(pvVar7);
    std::__cxx11::string::operator+=((string *)&rest_3,'\'');
    std::__cxx11::string::operator+=((string *)&rest_3,(string *)pbVar9);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rest_3);
    std::__cxx11::string::~string((string *)&rest_3);
    break;
  case 0x51:
  case 0x74:
    std::__cxx11::string::string(local_310);
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at
                       ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)offset,0);
    any_cast<char>(pvVar7);
    std::__cxx11::string::push_back((char)local_310);
    any::any<std::__cxx11::string,void>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310);
    std::__cxx11::string::~string(local_310);
    break;
  case 0x54:
  case 0x66:
    local_50f[10] = 0x2e;
    any::any<char,void>(__return_storage_ptr__,local_50f + 10);
    break;
  case 0x56:
  case 0x5c:
  case 0x62:
    local_50f[0xc] = 0x27;
    any::any<char,void>(__return_storage_ptr__,local_50f + 0xc);
    break;
  case 0x58:
  case 0x5e:
  case 0x61:
    local_50f[0xe] = 0x22;
    any::any<char,void>(__return_storage_ptr__,local_50f + 0xe);
    break;
  case 0x59:
  case 0x5f:
  case 99:
    local_50f[0xd] = 0x5c;
    any::any<char,void>(__return_storage_ptr__,local_50f + 0xd);
    break;
  case 0x65:
    local_50f[0xb] = 0x3a;
    any::any<char,void>(__return_storage_ptr__,local_50f + 0xb);
    break;
  case 0x68:
    local_50f[8] = 0x7c;
    any::any<char,void>(__return_storage_ptr__,local_50f + 8);
    break;
  case 0x69:
    local_50f[7] = 0x5b;
    any::any<char,void>(__return_storage_ptr__,local_50f + 7);
    break;
  case 0x6a:
    local_50f[6] = 0x5d;
    any::any<char,void>(__return_storage_ptr__,local_50f + 6);
    break;
  case 0x6b:
    local_50f[5] = 0x7b;
    any::any<char,void>(__return_storage_ptr__,local_50f + 5);
    break;
  case 0x6c:
    local_50f[4] = 0x7d;
    any::any<char,void>(__return_storage_ptr__,local_50f + 4);
    break;
  case 0x6d:
    local_50f[3] = 0x3e;
    any::any<char,void>(__return_storage_ptr__,local_50f + 3);
    break;
  case 0x6e:
    local_50f[2] = 0x2c;
    any::any<char,void>(__return_storage_ptr__,local_50f + 2);
    break;
  case 0x6f:
    local_50f[1] = 0x25;
    any::any<char,void>(__return_storage_ptr__,local_50f + 1);
    break;
  case 0x70:
    local_50f[0] = '!';
    any::any<char,void>(__return_storage_ptr__,local_50f);
  }
  return __return_storage_ptr__;
}

Assistant:

any at_reduce(int prod, std::vector<any>& rhs) override final {
    switch (prod) {
      case yaml::PROD_DOC:
      case yaml::PROD_DOC2: {
        std::size_t offset = prod == yaml::PROD_DOC2 ? 1 : 0;
        OMEGA_H_CHECK(!rhs.at(offset).empty());
        auto& result_any = rhs.at(offset);
        OMEGA_H_CHECK(result_any.type() == typeid(InputMap));
        auto& map = any_cast<InputMap&>(result_any);
        map.used = true;
        return any(std::move(result_any));
      }
      case yaml::PROD_TOP_BMAP: {
        return any(std::move(rhs.at(0)));
      }
      case yaml::PROD_TOP_FIRST: {
        if (rhs.at(0).type() == typeid(NameValue)) {
          return map_first_item(rhs.at(0));
        }
        return any();
      }
      case yaml::PROD_TOP_NEXT: {
        if (rhs.at(1).type() == typeid(NameValue)) {
          if (rhs.at(0).type() == typeid(InputMap)) {
            return map_next_item(rhs.at(0), rhs.at(1));
          } else {
            return map_first_item(rhs.at(0));
          }
        } else {
          return any(std::move(rhs.at(0)));
        }
      }
      case yaml::PROD_BMAP_FIRST:
      case yaml::PROD_FMAP_FIRST: {
        OMEGA_H_CHECK(rhs.at(0).type() == typeid(NameValue));
        auto result_any = map_first_item(rhs.at(0));
        OMEGA_H_CHECK(result_any.type() == typeid(InputMap));
        return result_any;
      }
      case yaml::PROD_BMAP_NEXT: {
        return map_next_item(rhs.at(0), rhs.at(1));
      }
      case yaml::PROD_FMAP_NEXT: {
        return map_next_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_BMAP_SCALAR:
      case yaml::PROD_FMAP_SCALAR: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_FMAP_FMAP: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_FMAP_FSEQ: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BMAP_BSCALAR: {
        return map_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_BMAP_BVALUE: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BVALUE_EMPTY: {
        return InputMap();
      }
      case yaml::PROD_BVALUE_BMAP: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BVALUE_BSEQ: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BMAP_FMAP: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BMAP_FSEQ: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BSEQ_FIRST: {
        return seq_first_item(rhs.at(0));
      }
      case yaml::PROD_BSEQ_NEXT: {
        return seq_next_item(rhs.at(0), rhs.at(1));
      }
      case yaml::PROD_BSEQ_SCALAR: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BSCALAR: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_BSEQ_BMAP:
      case yaml::PROD_BSEQ_FMAP: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BMAP_TRAIL: {
        return any(std::move(rhs.at(4)));
      }
      case yaml::PROD_BSEQ_BSEQ:
      case yaml::PROD_BSEQ_FSEQ: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BSEQ_TRAIL: {
        return any(std::move(rhs.at(4)));
      }
      case yaml::PROD_FMAP: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_FMAP_EMPTY: {
        return InputMap();
      }
      case yaml::PROD_FSEQ: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_FSEQ_EMPTY: {
        return InputList();
      }
      case yaml::PROD_FSEQ_FIRST: {
        return seq_first_item(rhs.at(0));
      }
      case yaml::PROD_FSEQ_NEXT: {
        return seq_next_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_FSEQ_SCALAR: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_FSEQ_FSEQ: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_FSEQ_FMAP: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_SCALAR_QUOTED:
      case yaml::PROD_MAP_SCALAR_QUOTED: {
        return any(std::move(rhs.at(0)));
      }
      case yaml::PROD_SCALAR_RAW:
      case yaml::PROD_MAP_SCALAR_RAW: {
        std::string text;
        OMEGA_H_CHECK(!rhs.at(0).empty());
        text = any_cast<std::string&&>(std::move(rhs.at(0)));
        text += any_cast<std::string&>(rhs.at(1));
        if (prod == yaml::PROD_MAP_SCALAR_RAW) {
          text += any_cast<std::string&>(rhs.at(2));
        }
        return remove_trailing_whitespace(text);
      }
      case yaml::PROD_SCALAR_HEAD_OTHER:
      case yaml::PROD_SCALAR_HEAD_DOT:
      case yaml::PROD_SCALAR_HEAD_DASH:
      case yaml::PROD_SCALAR_HEAD_DOT_DOT: {
        std::size_t offset;
        if (prod == yaml::PROD_SCALAR_HEAD_OTHER)
          offset = 0;
        else if (prod == yaml::PROD_SCALAR_HEAD_DOT_DOT)
          offset = 2;
        else
          offset = 1;
        char second = any_cast<char>(rhs.at(offset));
        std::string result;
        if (prod == yaml::PROD_SCALAR_HEAD_DOT)
          result += '.';
        else if (prod == yaml::PROD_SCALAR_HEAD_DASH)
          result += '-';
        else if (prod == yaml::PROD_SCALAR_HEAD_DOT_DOT)
          result += "..";
        result += second;
        return any(std::move(result));
      }
      case yaml::PROD_SCALAR_DQUOTED:
      case yaml::PROD_SCALAR_SQUOTED: {
        auto text = any_cast<std::string&&>(std::move(rhs.at(1)));
        text += any_cast<std::string&>(rhs.at(2));
        return any(std::move(text));
      }
      case yaml::PROD_MAP_SCALAR_ESCAPED_EMPTY: {
        return std::string();
      }
      case yaml::PROD_MAP_SCALAR_ESCAPED_NEXT: {
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += ',';
        str += any_cast<std::string&>(rhs.at(2));
        return any(std::move(str));
      }
      case yaml::PROD_TAG: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_BSCALAR: {
        auto parent_indent_level = this->symbol_indentation_stack.at(
            this->symbol_indentation_stack.size() - 5);
        auto& header = any_cast<std::string&>(rhs.at(0));
        auto& leading_empties_or_comments = any_cast<std::string&>(rhs.at(2));
        auto& rest = any_cast<std::string&>(rhs.at(4));
        std::string content;
        std::string ignored_comment;
        handle_block_scalar(parent_indent_level, header,
            leading_empties_or_comments, rest, content, ignored_comment);
        return any(std::move(content));
      }
      case yaml::PROD_BSCALAR_FIRST: {
        return any(std::move(rhs.at(0)));
      }
      // all these cases reduce to concatenating two strings
      case yaml::PROD_BSCALAR_NEXT:
      case yaml::PROD_BSCALAR_LINE:
      case yaml::PROD_DESCAPE_NEXT:
      case yaml::PROD_SESCAPE_NEXT: {
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += any_cast<std::string&>(rhs.at(1));
        return any(std::move(str));
      }
      case yaml::PROD_BSCALAR_INDENT: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BSCALAR_HEADER_LITERAL:
      case yaml::PROD_BSCALAR_HEADER_FOLDED: {
        std::string result;
        if (prod == yaml::PROD_BSCALAR_HEADER_LITERAL) {
          result += "|";
        } else {
          result += ">";
        }
        auto& rest = any_cast<std::string&>(rhs.at(1));
        result += rest;
        return any(std::move(result));
      }
      case yaml::PROD_DESCAPE: {
        std::string str;
        auto& rest = any_cast<std::string&>(rhs.at(2));
        str += any_cast<char>(rhs.at(1));
        str += rest;
        return any(std::move(str));
      }
      case yaml::PROD_SESCAPE: {
        std::string str;
        auto& rest = any_cast<std::string&>(rhs.at(2));
        str += '\'';
        str += rest;
        return any(std::move(str));
      }
      case yaml::PROD_OTHER_FIRST:
      case yaml::PROD_SPACE_PLUS_FIRST: {
        std::string str;
        str.push_back(any_cast<char>(rhs.at(0)));
        return any(std::move(str));
      }
      case yaml::PROD_SCALAR_TAIL_SPACE:
      case yaml::PROD_SCALAR_TAIL_OTHER:
      case yaml::PROD_DESCAPED_DQUOTED:
      case yaml::PROD_DQUOTED_COMMON:
      case yaml::PROD_SQUOTED_COMMON:
      case yaml::PROD_ANY_COMMON:
      case yaml::PROD_COMMON_SPACE:
      case yaml::PROD_COMMON_OTHER:
      case yaml::PROD_BSCALAR_HEAD_OTHER: {
        return any(std::move(rhs.at(0)));
      }
      // all these cases reduce to appending a character
      case yaml::PROD_DQUOTED_NEXT:
      case yaml::PROD_SQUOTED_NEXT:
      case yaml::PROD_ANY_NEXT:
      case yaml::PROD_SCALAR_TAIL_NEXT:
      case yaml::PROD_SPACE_STAR_NEXT:
      case yaml::PROD_SPACE_PLUS_NEXT:
      case yaml::PROD_BSCALAR_HEAD_NEXT: {
        if (rhs.at(0).empty()) {
          std::stringstream ss;
          ss << "leading characters in " << prod << ": any was empty\n";
          throw ParserFail(ss.str());
        }
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += any_cast<char>(rhs.at(1));
        return any(std::move(str));
      }
      case yaml::PROD_DQUOTED_EMPTY:
      case yaml::PROD_SQUOTED_EMPTY:
      case yaml::PROD_ANY_EMPTY:
      case yaml::PROD_DESCAPE_EMPTY:
      case yaml::PROD_SESCAPE_EMPTY:
      case yaml::PROD_SCALAR_TAIL_EMPTY:
      case yaml::PROD_SPACE_STAR_EMPTY:
      case yaml::PROD_BSCALAR_HEAD_EMPTY: {
        return std::string();
      }
      case yaml::PROD_DESCAPED_DQUOT:
      case yaml::PROD_SQUOTED_DQUOT:
      case yaml::PROD_ANY_DQUOT: {
        return '"';
      }
      case yaml::PROD_DESCAPED_SLASH:
      case yaml::PROD_SQUOTED_SLASH:
      case yaml::PROD_ANY_SLASH: {
        return '\\';
      }
      case yaml::PROD_SCALAR_TAIL_SQUOT:
      case yaml::PROD_DQUOTED_SQUOT:
      case yaml::PROD_ANY_SQUOT: {
        return '\'';
      }
      case yaml::PROD_COMMON_COLON: {
        return ':';
      }
      case yaml::PROD_SCALAR_TAIL_DOT:
      case yaml::PROD_COMMON_DOT: {
        return '.';
      }
      case yaml::PROD_SCALAR_TAIL_DASH:
      case yaml::PROD_COMMON_DASH:
      case yaml::PROD_BSCALAR_HEAD_DASH: {
        return '-';
      }
      case yaml::PROD_COMMON_PIPE: {
        return '|';
      }
      case yaml::PROD_COMMON_LSQUARE: {
        return '[';
      }
      case yaml::PROD_COMMON_RSQUARE: {
        return ']';
      }
      case yaml::PROD_COMMON_LCURLY: {
        return '{';
      }
      case yaml::PROD_COMMON_RCURLY: {
        return '}';
      }
      case yaml::PROD_COMMON_RANGLE: {
        return '>';
      }
      case yaml::PROD_COMMON_COMMA: {
        return ',';
      }
      case yaml::PROD_COMMON_PERCENT: {
        return '%';
      }
      case yaml::PROD_COMMON_EXCL: {
        return '!';
      }
    }
    return any();
  }